

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.cpp
# Opt level: O0

ostream * operator<<(ostream *os,vec4f *v)

{
  ostream *poVar1;
  vec4f *v_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,'(');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)v);
  poVar1 = std::operator<<(poVar1,',');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(v + 4));
  poVar1 = std::operator<<(poVar1,',');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(v + 8));
  poVar1 = std::operator<<(poVar1,',');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(v + 0xc));
  poVar1 = std::operator<<(poVar1,')');
  return poVar1;
}

Assistant:

std::ostream& operator << (std::ostream& os, const vec4f& v) {
	return os << '(' << v.x << ',' << v.y << ',' << v.z << ',' << v.w << ')';
}